

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chillout.cpp
# Opt level: O2

void __thiscall
Debug::Chillout::setBacktraceCallback(Chillout *this,function<void_(const_char_*)> *callback)

{
  PosixCrashHandler *this_00;
  
  this_00 = PosixCrashHandler::getInstance();
  PosixCrashHandler::setBacktraceCallback(this_00,callback);
  return;
}

Assistant:

void Chillout::setBacktraceCallback(const std::function<void(const char * const)> &callback) {
#ifdef _WIN32
        WindowsCrashHandler &handler = WindowsCrashHandler::getInstance();
#else
        PosixCrashHandler &handler = PosixCrashHandler::getInstance();
#endif
        handler.setBacktraceCallback(callback);
    }